

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate.cc
# Opt level: O2

unique_ptr<bssl::Certificate,_std::default_delete<bssl::Certificate>_>
bssl::Certificate::FromDER(Span<const_unsigned_char> der,string *out_diagnostic)

{
  element_type *peVar1;
  __single_object _Var2;
  tuple<crypto_buffer_st_*,_bssl::internal::Deleter> tVar3;
  __uniq_ptr_data<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>,_true,_true>
  *p_Var4;
  string *in_RCX;
  __uniq_ptr_data<bssl::Certificate,_std::default_delete<bssl::Certificate>,_true,_true> _Var5;
  ParseCertificateOptions local_91;
  UniquePtr<CRYPTO_BUFFER> buffer;
  shared_ptr<const_bssl::ParsedCertificate> result;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_78;
  shared_ptr<const_bssl::ParsedCertificate> parsed_cert;
  CertErrors errors;
  __single_object internals;
  __uniq_ptr_impl<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
  local_28;
  
  _Var5.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>._M_t.
  super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
  super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl =
       (__uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>)der.data_;
  local_91.allow_invalid_serial_numbers = true;
  tVar3.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>)
       CRYPTO_BUFFER_new((uint8_t *)der.size_,(size_t)out_diagnostic,(CRYPTO_BUFFER_POOL *)0x0);
  buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
       tVar3.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
  CertErrors::CertErrors(&errors);
  buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0;
  local_78._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       tVar3.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
  ParsedCertificate::Create
            ((ParsedCertificate *)&parsed_cert,(UniquePtr<CRYPTO_BUFFER> *)&local_78,&local_91,
             &errors);
  ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_78);
  peVar1 = parsed_cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (parsed_cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    CertErrors::ToDebugString_abi_cxx11_((string *)&internals,&errors);
    ::std::__cxx11::string::operator=(in_RCX,(string *)&internals);
    ::std::__cxx11::string::~string((string *)&internals);
    result.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    result.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    result.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         parsed_cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    result.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         = parsed_cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount;
    parsed_cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    parsed_cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parsed_cert.
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CertErrors::~CertErrors(&errors);
  ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buffer);
  if (peVar1 == (element_type *)0x0) {
    *(undefined8 *)
     _Var5.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>._M_t.
     super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
     super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl = 0;
  }
  else {
    ::std::make_unique<bssl::CertificateInternals>();
    ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *)
               internals._M_t.
               super___uniq_ptr_impl<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
               ._M_t.
               super__Tuple_impl<0UL,_bssl::CertificateInternals_*,_std::default_delete<bssl::CertificateInternals>_>
               .super__Head_base<0UL,_bssl::CertificateInternals_*,_false>._M_head_impl,
               &result.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
              );
    p_Var4 = (__uniq_ptr_data<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>,_true,_true>
              *)operator_new(8);
    _Var2 = internals;
    internals._M_t.
    super___uniq_ptr_impl<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
    ._M_t.
    super__Tuple_impl<0UL,_bssl::CertificateInternals_*,_std::default_delete<bssl::CertificateInternals>_>
    .super__Head_base<0UL,_bssl::CertificateInternals_*,_false>._M_head_impl =
         (__uniq_ptr_data<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>,_true,_true>
          )(__uniq_ptr_impl<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
            )0x0;
    p_Var4->
    super___uniq_ptr_impl<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
         = (__uniq_ptr_impl<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
            )_Var2._M_t.
             super___uniq_ptr_impl<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
             ._M_t.
             super__Tuple_impl<0UL,_bssl::CertificateInternals_*,_std::default_delete<bssl::CertificateInternals>_>
             .super__Head_base<0UL,_bssl::CertificateInternals_*,_false>._M_head_impl;
    local_28._M_t.
    super__Tuple_impl<0UL,_bssl::CertificateInternals_*,_std::default_delete<bssl::CertificateInternals>_>
    .super__Head_base<0UL,_bssl::CertificateInternals_*,_false>._M_head_impl =
         (tuple<bssl::CertificateInternals_*,_std::default_delete<bssl::CertificateInternals>_>)
         (_Tuple_impl<0UL,_bssl::CertificateInternals_*,_std::default_delete<bssl::CertificateInternals>_>
          )0x0;
    *(__uniq_ptr_data<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>,_true,_true>
      **)_Var5.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>.
         _M_t.super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
         super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl = p_Var4;
    ::std::unique_ptr<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
    ::~unique_ptr((unique_ptr<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
                   *)&local_28);
    ::std::unique_ptr<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
    ::~unique_ptr(&internals);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&result.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (__uniq_ptr_data<bssl::Certificate,_std::default_delete<bssl::Certificate>,_true,_true>)
         (tuple<bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>)
         _Var5.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>.
         _M_t.super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
         super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Certificate> Certificate::FromDER(bssl::Span<const uint8_t> der,
                                                  std::string *out_diagnostic) {
  std::shared_ptr<const bssl::ParsedCertificate> result =
      ParseCertificateFromDer(der, out_diagnostic);
  if (result == nullptr) {
    return nullptr;
  }

  auto internals = std::make_unique<CertificateInternals>();
  internals->cert = std::move(result);
  std::unique_ptr<Certificate> ret(new Certificate(std::move(internals)));
  return ret;
}